

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O1

MPP_RET camera_source_deinit(CamSource *ctx)

{
  MppBuffer pvVar1;
  ulong uVar2;
  RK_S32 *pRVar3;
  v4l2_buf_type type;
  v4l2_buffer buf;
  v4l2_buf_type local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((ctx != (CamSource *)0x0) && (-1 < ctx->fd)) {
    local_8c = ctx->type;
    camera_source_ioctl(ctx->fd,0x40045613,&local_8c);
    if (ctx->bufcnt != 0) {
      pRVar3 = &ctx->fbuf[0].export_fd;
      uVar2 = 0;
      do {
        uStack_80 = 0;
        local_58 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_38 = 0;
        uStack_50 = 0x100000000;
        local_88 = CONCAT44(local_8c,(int)uVar2);
        camera_source_ioctl(ctx->fd,-0x3fa7a9f7,&local_88);
        pvVar1 = ctx->fbuf[local_88 & 0xffffffff].buffer;
        if (pvVar1 != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller(pvVar1,"camera_source_deinit");
        }
        munmap(ctx->fbuf[local_88 & 0xffffffff].start,ctx->fbuf[local_88 & 0xffffffff].length);
        close(*pRVar3);
        uVar2 = uVar2 + 1;
        pRVar3 = pRVar3 + 8;
      } while (uVar2 < ctx->bufcnt);
    }
    close(ctx->fd);
    mpp_osal_free("camera_source_deinit",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET camera_source_deinit(CamSource *ctx)
{
    struct v4l2_buffer buf;
    enum v4l2_buf_type type;
    RK_U32 i;

    if (NULL == ctx)
        return MPP_OK;

    if (ctx->fd < 0)
        return MPP_OK;

    // Stop capturing
    type = ctx->type;

    camera_source_ioctl(ctx->fd, VIDIOC_STREAMOFF, &type);

    // un-mmap() buffers
    for (i = 0 ; i < ctx->bufcnt; i++) {
        buf = (struct v4l2_buffer) {0};
        buf.type    = type;
        buf.memory  = V4L2_MEMORY_MMAP;
        buf.index   = i;
        camera_source_ioctl(ctx->fd, VIDIOC_QUERYBUF, &buf);
        if (ctx->fbuf[buf.index].buffer) {
            mpp_buffer_put(ctx->fbuf[buf.index].buffer);
        }
        munmap(ctx->fbuf[buf.index].start, ctx->fbuf[buf.index].length);
        close(ctx->fbuf[i].export_fd);
    }

    // Close v4l2 device
    close(ctx->fd);
    MPP_FREE(ctx);
    return MPP_OK;
}